

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

QtInstallDirectoryWithTriple * __thiscall
QHash<QString,_QtInstallDirectoryWithTriple>::operator[]
          (QHash<QString,_QtInstallDirectoryWithTriple> *this,QString *key)

{
  QtInstallDirectoryWithTriple *pQVar1;
  long in_FS_OFFSET;
  QString *in_stack_ffffffffffffffb8;
  QHash<QString,_QtInstallDirectoryWithTriple> local_20 [3];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  tryEmplace<>(local_20,in_stack_ffffffffffffffb8);
  pQVar1 = iterator::operator*((iterator *)0x13fd43);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return pQVar1;
  }
  __stack_chk_fail();
}

Assistant:

T &operator[](const Key &key)
    {
        return *tryEmplace(key).iterator;
    }